

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O2

int GetValuePololu(POLOLU *pPololu,int channel,int *pValue)

{
  int iVar1;
  int iVar2;
  uchar recvbuf [512];
  uchar sendbuf [512];
  
  memset(sendbuf,0,0x200);
  sendbuf[0] = 0xaa;
  sendbuf[1] = (uchar)pPololu->DeviceNumber;
  sendbuf[2] = '\x10';
  sendbuf[3] = (uchar)channel;
  iVar1 = WriteAllRS232Port(&pPololu->RS232Port,sendbuf,4);
  iVar2 = 1;
  if (iVar1 == 0) {
    if ((pPololu->bSaveRawData != 0) && ((FILE *)pPololu->pfSaveFile != (FILE *)0x0)) {
      fwrite(sendbuf,4,1,(FILE *)pPololu->pfSaveFile);
      fflush((FILE *)pPololu->pfSaveFile);
    }
    mSleep(10);
    memset(recvbuf,0,0x200);
    iVar1 = ReadAllRS232Port(&pPololu->RS232Port,recvbuf,2);
    if (iVar1 == 0) {
      if ((pPololu->bSaveRawData != 0) && ((FILE *)pPololu->pfSaveFile != (FILE *)0x0)) {
        fwrite(recvbuf,2,1,(FILE *)pPololu->pfSaveFile);
        fflush((FILE *)pPololu->pfSaveFile);
      }
      *pValue = (uint)(ushort)recvbuf._0_2_;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

inline int GetValuePololu(POLOLU* pPololu, int channel, int* pValue)
{
	unsigned char sendbuf[MAX_NB_BYTES_POLOLU];
	unsigned char recvbuf[MAX_NB_BYTES_POLOLU];
	int sendbuflen = 0;
	int recvbuflen = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
	sendbuf[1] = (unsigned char)pPololu->DeviceNumber;
	sendbuf[2] = (unsigned char)(GET_POSITION_COMMAND_POLOLU & 0x7F);
	sendbuf[3] = (unsigned char)channel;
	sendbuflen = 4;

	if (WriteAllRS232Port(&pPololu->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	mSleep(10); // Added because sometimes there was a timeout on the read() 
	// (even though the data were available if read just after the timeout...)...

	// Prepare the buffer that should receive data from device.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 2;

	if (ReadAllRS232Port(&pPololu->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	// Display and analyze received data.
	//printf("Received : \"%s\"\n", recvbuf);
	*pValue = recvbuf[0] + 256*recvbuf[1];

	return EXIT_SUCCESS;
}